

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaDemuxer.cpp
# Opt level: O1

int __thiscall MatroskaDemuxer::readPacket(MatroskaDemuxer *this,AVPacket *avPacket)

{
  int *levelUp;
  uint8_t *puVar1;
  _Elt_pointer ppAVar2;
  AVPacket *pAVar3;
  int iVar4;
  int64_t *piVar5;
  long lVar6;
  int iVar7;
  AVPacket *pAVar8;
  byte bVar9;
  uint32_t id;
  uint32_t id_1;
  uint32_t local_50;
  uint32_t local_4c;
  AVPacket *local_48;
  AVPacket *local_40;
  queue<AVPacket_*,_std::deque<AVPacket_*,_std::allocator<AVPacket_*>_>_> *local_38;
  
  bVar9 = 0;
  local_48 = avPacket;
  if (this->m_lastDeliveryPacket != (AVPacket *)0x0) {
    puVar1 = this->m_lastDeliveryPacket->data;
    if (puVar1 != (uint8_t *)0x0) {
      operator_delete__(puVar1);
    }
    if (this->m_lastDeliveryPacket != (AVPacket *)0x0) {
      operator_delete(this->m_lastDeliveryPacket,0x50);
    }
    this->m_lastDeliveryPacket = (AVPacket *)0x0;
  }
  local_38 = &this->packets;
  levelUp = &this->level_up;
  local_40 = (AVPacket *)0x0;
  do {
    ppAVar2 = (this->packets).c.super__Deque_base<AVPacket_*,_std::allocator<AVPacket_*>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur;
    if ((this->packets).c.super__Deque_base<AVPacket_*,_std::allocator<AVPacket_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur != ppAVar2) {
      local_40 = *ppAVar2;
      std::deque<AVPacket_*,_std::allocator<AVPacket_*>_>::pop_front(&local_38->c);
      pAVar3 = local_40;
      if (local_40 == (AVPacket *)0x0) {
        piVar5 = (int64_t *)operator_new(0x50);
        *piVar5 = 0;
        piVar5[1] = 0;
        piVar5[2] = 0;
        piVar5[3] = 0;
        *(undefined4 *)(piVar5 + 4) = 0;
        piVar5[5] = 0;
        piVar5[6] = 0;
        piVar5[7] = 0;
        piVar5[8] = 0;
        *(undefined4 *)(piVar5 + 9) = 0;
        pAVar8 = local_48;
        for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
          pAVar8->pts = *piVar5;
          piVar5 = piVar5 + (ulong)bVar9 * -2 + 1;
          pAVar8 = (AVPacket *)((long)pAVar8 + (ulong)bVar9 * -0x10 + 8);
        }
        local_48->codecID = 0;
      }
      else {
        for (lVar6 = 10; lVar6 != 0; lVar6 = lVar6 + -1) {
          local_48->pts = local_40->pts;
          local_40 = (AVPacket *)((long)local_40 + (ulong)bVar9 * -0x10 + 8);
          local_48 = (AVPacket *)((long)local_48 + (ulong)bVar9 * -0x10 + 8);
        }
      }
      this->m_lastDeliveryPacket = pAVar3;
      return 0;
    }
    if (this->done != false) {
      return 1;
    }
    iVar4 = 0;
    do {
      if (iVar4 != 0) goto LAB_0019e601;
      iVar4 = ebml_read_element_id(this,&local_4c,levelUp);
      local_50 = 0;
      if (-1 < iVar4) {
        local_50 = local_4c;
      }
      if (local_50 == 0) {
        return 1;
      }
      iVar7 = *levelUp;
      if (iVar7 != 0) {
        iVar4 = 0;
        break;
      }
      if (local_50 == 0x1a45dfa3) {
        matroska_read_header(this);
        iVar4 = 0;
      }
      else if (local_50 == 0x1f43b675) {
        iVar4 = ebml_read_master(this,&local_50);
        if (-1 < iVar4) {
          iVar4 = matroska_parse_cluster(this);
          iVar4 = iVar4 + (uint)(iVar4 == 0);
        }
      }
      else {
        iVar4 = ebml_read_skip(this);
      }
      iVar7 = *levelUp;
    } while (iVar7 == 0);
    *levelUp = iVar7 + -1;
LAB_0019e601:
    if (iVar4 == -1) {
      this->done = true;
    }
  } while( true );
}

Assistant:

int MatroskaDemuxer::readPacket(AVPacket &avPacket)
{
    uint32_t id;
    if (m_lastDeliveryPacket)
    {
        delete[] m_lastDeliveryPacket->data;
        delete m_lastDeliveryPacket;
        m_lastDeliveryPacket = nullptr;
    }

    // Read stream until we have a packet queued.
    AVPacket *newPacket = nullptr;
    while (matroska_deliver_packet(newPacket) != 0)
    {
        // Have we already reached the end?
        if (done)
            return BufferedReader::DATA_EOF;

        int res = 0;
        while (res == 0)
        {
            if ((id = ebml_peek_id(&level_up)) == 0)
            {
                return BufferedReader::DATA_EOF;
            }
            if (level_up)
            {
                level_up--;
                break;
            }

            switch (id)
            {
            case MATROSKA_ID_CLUSTER:
                if ((res = ebml_read_master(&id)) < 0)
                    break;
                if ((res = matroska_parse_cluster()) == 0)
                    res = 1;  // Parsed one cluster, let's get out.
                break;
            case EBML_ID_HEADER:
                matroska_read_header();
                break;
            default:
                res = ebml_read_skip();
            }

            if (level_up)
            {
                level_up--;
                break;
            }
        }

        if (res == -1)
            done = true;
    }
    if (newPacket)
    {
        memcpy(&avPacket, newPacket, sizeof(AVPacket));
    }
    else
        avPacket = *new AVPacket();
    m_lastDeliveryPacket = newPacket;
    return 0;
}